

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinimizeRecGroups.cpp
# Opt level: O3

HeapType __thiscall wasm::anon_unknown_0::BrandTypeIterator::operator*(BrandTypeIterator *this)

{
  pointer pFVar1;
  Field *__cur;
  ulong uVar2;
  pointer pFVar3;
  Array local_68;
  Struct local_58;
  HeapType local_40;
  void *local_38;
  undefined8 uStack_30;
  long local_28;
  
  if (this->useArray == true) {
    pFVar3 = (this->fields).
             super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar2 = (ulong)pFVar3->index;
    local_68.element._8_8_ = (&DAT_010b1e68)[uVar2 * 2] & 0xffffffff;
    if (pFVar3->immutable == false) {
      local_68.element._8_8_ = (&DAT_010b1e68)[uVar2 * 2];
    }
    local_68.element.type.id =
         (&wasm::(anonymous_namespace)::BrandTypeIterator::fieldOptions)[uVar2 * 2];
    HeapType::HeapType(&local_40,&local_68);
  }
  else {
    pFVar3 = (this->fields).
             super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pFVar1 = (this->fields).
             super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_38 = (void *)0x0;
    uStack_30 = 0;
    local_28 = 0;
    uVar2 = (long)pFVar1 - (long)pFVar3 >> 1;
    if (uVar2 >> 0x3b != 0) {
      std::__throw_length_error("cannot create std::vector larger than max_size()");
    }
    if (pFVar1 == pFVar3) {
      local_58.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)(uVar2 << 4);
      local_58.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_start = (Field *)0x0;
      local_58.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_finish = (Field *)0x0;
    }
    else {
      local_58.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_start =
           __gnu_cxx::new_allocator<wasm::Field>::allocate
                     ((new_allocator<wasm::Field> *)&local_38,uVar2,(void *)0x0);
      local_58.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_58.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
           super__Vector_impl_data._M_start + uVar2;
      local_58.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_58.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
           super__Vector_impl_data._M_start;
      do {
        uVar2 = (&DAT_010b1e68)[(ulong)pFVar3->index * 2] & 0xffffffff;
        if (pFVar3->immutable == false) {
          uVar2 = (&DAT_010b1e68)[(ulong)pFVar3->index * 2];
        }
        ((local_58.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
          super__Vector_impl_data._M_finish)->type).id =
             (&wasm::(anonymous_namespace)::BrandTypeIterator::fieldOptions)
             [(ulong)pFVar3->index * 2];
        (local_58.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
         super__Vector_impl_data._M_finish)->packedType = (int)uVar2;
        (local_58.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
         super__Vector_impl_data._M_finish)->mutable_ = (int)(uVar2 >> 0x20);
        pFVar3 = pFVar3 + 1;
        local_58.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_58.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      } while (pFVar3 != pFVar1);
    }
    local_38 = (void *)0x0;
    uStack_30 = 0;
    local_28 = 0;
    HeapType::HeapType(&local_40,&local_58);
    if (local_58.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
        super__Vector_impl_data._M_start != (Field *)0x0) {
      operator_delete(local_58.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.fields.
                            super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.fields.
                            super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_38 != (void *)0x0) {
      operator_delete(local_38,local_28 - (long)local_38);
    }
  }
  return (HeapType)local_40.id;
}

Assistant:

HeapType operator*() const {
    if (useArray) {
      return Array(fields[0]);
    }
    return Struct(std::vector<Field>(fields.begin(), fields.end()));
  }